

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void Vaxpy_Serial(sunrealtype a,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = *x->content;
  lVar1 = *(long *)((long)x->content + 0x10);
  lVar2 = *(long *)((long)y->content + 0x10);
  lVar3 = 0;
  if ((a != 1.0) || (NAN(a))) {
    if (0 < lVar4) {
      lVar3 = lVar4;
    }
    lVar4 = 0;
    if ((a != -1.0) || (NAN(a))) {
      for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
        *(double *)(lVar2 + lVar4 * 8) =
             *(double *)(lVar1 + lVar4 * 8) * a + *(double *)(lVar2 + lVar4 * 8);
      }
    }
    else {
      for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
        *(double *)(lVar2 + lVar4 * 8) =
             *(double *)(lVar2 + lVar4 * 8) - *(double *)(lVar1 + lVar4 * 8);
      }
    }
  }
  else {
    if (lVar4 < 1) {
      lVar4 = lVar3;
    }
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      *(double *)(lVar2 + lVar3 * 8) =
           *(double *)(lVar1 + lVar3 * 8) + *(double *)(lVar2 + lVar3 * 8);
    }
  }
  return;
}

Assistant:

static void Vaxpy_Serial(sunrealtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE)
  {
    for (i = 0; i < N; i++) { yd[i] += xd[i]; }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < N; i++) { yd[i] -= xd[i]; }
    return;
  }

  for (i = 0; i < N; i++) { yd[i] += a * xd[i]; }

  return;
}